

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void iterate_md5_digest(MD5 *md5,Digest *digest,int iterations,int key_len)

{
  Digest *data;
  size_t len;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  size_t n;
  size_t n_00;
  size_t extraout_RDX_00;
  undefined1 local_38 [8];
  MD5 m;
  int local_20;
  int i;
  int key_len_local;
  int iterations_local;
  Digest *digest_local;
  MD5 *md5_local;
  
  local_20 = key_len;
  i = iterations;
  _key_len_local = digest;
  digest_local = (Digest *)md5;
  MD5::digest(md5,*digest);
  n = extraout_RDX;
  for (m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _4_4_ = 0;
      m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ < i;
      m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ + 1) {
    MD5::MD5((MD5 *)local_38,*digest,n,(uchar *)CONCAT44(in_register_0000000c,key_len));
    data = _key_len_local;
    len = QIntC::to_size<int>(&local_20);
    MD5::encodeDataIncrementally((MD5 *)local_38,(char *)data,len);
    digest = _key_len_local;
    MD5::digest((MD5 *)local_38,*_key_len_local);
    MD5::~MD5((MD5 *)local_38,*digest,n_00,(uchar *)CONCAT44(in_register_0000000c,key_len));
    n = extraout_RDX_00;
  }
  return;
}

Assistant:

static void
iterate_md5_digest(MD5& md5, MD5::Digest& digest, int iterations, int key_len)
{
    md5.digest(digest);

    for (int i = 0; i < iterations; ++i) {
        MD5 m;
        m.encodeDataIncrementally(reinterpret_cast<char*>(digest), QIntC::to_size(key_len));
        m.digest(digest);
    }
}